

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

void __thiscall
Omega_h::CmdLineFlag::add_arg<double>(CmdLineFlag *this,string *arg_name,double *defval)

{
  CmdLineArg<double> *this_00;
  unique_ptr<Omega_h::CmdLineArg<double>,_std::default_delete<Omega_h::CmdLineArg<double>_>_>
  local_30;
  unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> local_28;
  double *local_20;
  double *defval_local;
  string *arg_name_local;
  CmdLineFlag *this_local;
  
  local_20 = defval;
  defval_local = (double *)arg_name;
  arg_name_local = (string *)this;
  this_00 = (CmdLineArg<double> *)operator_new(0x38);
  CmdLineArg<double>::CmdLineArg(this_00,(string *)defval_local,local_20);
  std::unique_ptr<Omega_h::CmdLineArg<double>,std::default_delete<Omega_h::CmdLineArg<double>>>::
  unique_ptr<std::default_delete<Omega_h::CmdLineArg<double>>,void>
            ((unique_ptr<Omega_h::CmdLineArg<double>,std::default_delete<Omega_h::CmdLineArg<double>>>
              *)&local_30,this_00);
  std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>::
  unique_ptr<Omega_h::CmdLineArg<double>,std::default_delete<Omega_h::CmdLineArg<double>>,void>
            ((unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>> *)&local_28
             ,&local_30);
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::push_back(&this->args_,(value_type *)&local_28);
  std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<Omega_h::CmdLineArg<double>,_std::default_delete<Omega_h::CmdLineArg<double>_>_>::
  ~unique_ptr(&local_30);
  return;
}

Assistant:

void CmdLineFlag::add_arg(std::string const& arg_name, T const& defval) {
  args_.push_back(
      std::unique_ptr<CmdLineArg<T>>(new CmdLineArg<T>(arg_name, defval)));
}